

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::ir::copyWithReplacedDest
          (ir *this,shared_ptr<mocker::ir::IRInst> *inst,shared_ptr<mocker::ir::Reg> *newDest)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::IRInst> sVar1;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_38;
  shared_ptr<mocker::ir::Reg> *local_20;
  shared_ptr<mocker::ir::Reg> *newDest_local;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  
  local_20 = newDest;
  newDest_local = (shared_ptr<mocker::ir::Reg> *)inst;
  inst_local = (shared_ptr<mocker::ir::IRInst> *)this;
  getOperandsUsed(&local_38,inst);
  anon_unknown_66::copyWithReplacedDestAndOperands((anon_unknown_66 *)this,inst,newDest,&local_38);
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&local_38);
  sVar1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar1.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IRInst>
copyWithReplacedDest(const std::shared_ptr<ir::IRInst> &inst,
                     const std::shared_ptr<ir::Reg> &newDest) {
  return copyWithReplacedDestAndOperands(inst, newDest, getOperandsUsed(inst));
}